

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O1

void rde_aux(List *code,PatternRange *ranges,int m68kop,ParsedOpcodeInfo *info,CCVariant *var,
            int expand_mask)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  uVar9 = (ulong)(uint)expand_mask;
  do {
    if (code == (List *)0x0) {
      return;
    }
    uVar6 = (code->token).type - TOK_DOLLAR_DATA_REGISTER;
    if (7 < uVar6) goto LAB_0010deef;
    bVar1 = (code->token).u.reginfo.which;
    iVar2 = ranges[bVar1].index;
    uVar3 = ranges[bVar1].length;
    uVar5 = 0;
    if ((int)(uVar3 + iVar2) < 0x11) {
      bVar11 = 0 < (int)uVar3;
      if (0 < (int)uVar3) {
        uVar7 = 1 << (0xfU - (char)iVar2 & 0x1f);
        var = (CCVariant *)(ulong)uVar7;
        uVar8 = 1 << ((byte)uVar3 - 1 & 0x1f);
        uVar9 = (ulong)uVar8;
        uVar4 = 0;
        uVar5 = 0;
        do {
          if (*(char *)((long)iVar2 + *(long *)&info->cpu + uVar4) == '-') goto LAB_0010ddcf;
          uVar10 = (int)uVar8 >> ((byte)uVar4 & 0x1f);
          if (((int)uVar7 >> ((byte)uVar4 & 0x1f) & m68kop) == 0) {
            uVar10 = 0;
          }
          uVar5 = (ulong)((uint)uVar5 | uVar10);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
        bVar11 = uVar4 < uVar3;
      }
    }
    else {
LAB_0010ddcf:
      bVar11 = true;
    }
    uVar7 = (uint)uVar5;
    if (bVar11) goto LAB_0010deef;
    switch(uVar6) {
    case 0:
      (code->token).type = TOK_DATA_REGISTER;
      break;
    case 1:
      (code->token).type = TOK_ADDRESS_REGISTER;
      break;
    case 2:
      uVar6 = uVar7 + 7;
      if (-1 < (int)uVar7) {
        uVar6 = uVar7;
      }
      (code->token).type = 7 < (int)uVar7 | TOK_DATA_REGISTER;
      uVar5 = (ulong)(uVar7 - (uVar6 & 0xf8));
      break;
    case 3:
      if (((uint)(uVar5 >> 3) & 7) == 1) {
        (code->token).type = TOK_ADDRESS_REGISTER;
      }
      else {
        if ((uVar5 >> 3 & 7) != 0) {
          (code->token).type = TOK_AMODE;
          break;
        }
        (code->token).type = TOK_DATA_REGISTER;
      }
      uVar5 = (ulong)((byte)uVar5 & 7);
      break;
    case 4:
      if ((uVar7 & 7) == 1) {
        (code->token).type = TOK_ADDRESS_REGISTER;
        (code->token).u.reginfo.which = '\x01';
      }
      else if ((uVar5 & 7) == 0) {
        (code->token).type = TOK_DATA_REGISTER;
        (code->token).u.reginfo.which = '\0';
      }
      else {
        (code->token).type = TOK_REVERSED_AMODE;
        (code->token).u.reginfo.which = ((byte)(uVar7 >> 3) & 7) + (char)(uVar7 & 7) * '\b';
      }
      goto LAB_0010deef;
    case 5:
      (code->token).type = TOK_NUMBER;
      if (((code->token).u.reginfo.sgnd != '\0') &&
         (((ulong)(long)(int)uVar7 >> ((ulong)(uVar3 - 1 & 0xff) & 0x3f) & 1) != 0)) {
        uVar7 = uVar7 | (uint)(-1L << ((byte)uVar3 & 0x3f));
      }
      (code->token).u = (anon_union_8_7_0ba269be_for_u)(long)(int)uVar7;
      goto LAB_0010deef;
    default:
      fatal_error("Internal error: generate_code.c: IS_DOLLAR_TOKEN() must be bad.\n");
      goto LAB_0010deef;
    }
    (code->token).u.reginfo.which = (uchar)uVar5;
LAB_0010deef:
    rde_aux(code->car,ranges,m68kop,info,var,(int)uVar9);
    code = code->cdr;
  } while( true );
}

Assistant:

static void
rde_aux (List *code, const PatternRange *ranges, int m68kop,
	 const ParsedOpcodeInfo *info, const CCVariant *var, int expand_mask)
{
  Token *t;

  /* Base case: NULL list. */
  if (code == NULL)
    return;

  /* If we find a $ identifier, replace it with the appropriate expression. */
  t = &code->token;
  if (IS_DOLLAR_TOKEN (t->type))
    {
      int index, length;
      BOOL is_constant = FALSE;
      int constant;
      
      /* Fetch the bit range of that field. */
      index = ranges[t->u.dollarinfo.which].index;
      length = ranges[t->u.dollarinfo.which].length;
      
      /* See if this collapses to a known constant. */
      if (index + length <= 16)
	{
	  int i;
	  
	  /* Grab the constant and see if it's legitimate. */
	  constant = 0;
	  is_constant = TRUE;
	  for (i = 0; i < length; i++)
	    {
	      if (var->bits_to_expand[i + index] == '-')
		{
		  is_constant = FALSE;
		  break;
		}
	      else if (m68kop & ((1 << (15 - index)) >> i))
		constant |= (1 << (length - 1)) >> i;
	    }
	}
      else
	constant = 0;  /* To avoid compiler warnings. */

      if (is_constant)
	handle_constant_dollar_field (code, constant, length);
      else
	{
	}
    }

  /* Recurse on the rest of the list. */
  rde_aux (code->car, ranges, m68kop, info, var, expand_mask);
  rde_aux (code->cdr, ranges, m68kop, info, var, expand_mask);
}